

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O0

int __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection::
close(Connection *this,int __fd)

{
  pointer psVar1;
  lowest_layer_type *plVar2;
  error_code eVar3;
  undefined1 local_20 [8];
  error_code ec;
  Connection *this_local;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)local_20);
  psVar1 = std::
           unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
           ::operator->(&this->socket);
  plVar2 = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>::lowest_layer(psVar1);
  asio::basic_socket<asio::ip::tcp>::shutdown(plVar2,2,(int)local_20);
  psVar1 = std::
           unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
           ::operator->(&this->socket);
  plVar2 = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>::lowest_layer(psVar1);
  eVar3 = asio::basic_socket<asio::ip::tcp>::cancel(plVar2,(error_code *)local_20);
  return (int)eVar3._M_cat;
}

Assistant:

void close() noexcept {
        error_code ec;
        socket->lowest_layer().shutdown(asio::ip::tcp::socket::shutdown_both, ec);
        socket->lowest_layer().cancel(ec);
      }